

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_ray_hit_info * rf_collision_ray_model(rf_ray ray,rf_model model)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  rf_mat mat;
  rf_int rVar5;
  ulong uVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  rf_ray_hit_info *in_RDI;
  float *pfVar12;
  float *pfVar13;
  rf_vec3 *vertdata;
  ulong uVar14;
  rf_vec3 rVar15;
  rf_vec3 rVar16;
  rf_vec3 rVar17;
  rf_ray_hit_info tri_hit_info;
  
  *(undefined8 *)&(in_RDI->position).z = 0;
  (in_RDI->normal).y = 0.0;
  (in_RDI->normal).z = 0.0;
  in_RDI->hit = false;
  *(undefined3 *)&in_RDI->field_0x1 = 0;
  in_RDI->distance = 0.0;
  (in_RDI->position).x = 0.0;
  (in_RDI->position).y = 0.0;
  rVar5 = model.mesh_count;
  if (model.mesh_count < 1) {
    rVar5 = 0;
  }
  for (lVar8 = 0; lVar8 != rVar5; lVar8 = lVar8 + 1) {
    pfVar3 = model.meshes[lVar8].vertices;
    if (pfVar3 != (float *)0x0) {
      uVar14 = (long)model.meshes[lVar8].vertex_count / 3;
      uVar6 = uVar14 & 0xffffffff;
      if ((int)uVar14 < 1) {
        uVar6 = 0;
      }
      pfVar13 = pfVar3 + 8;
      for (uVar14 = 0; uVar6 * 3 != uVar14; uVar14 = uVar14 + 3) {
        puVar4 = model.meshes[lVar8].indices;
        if (puVar4 == (unsigned_short *)0x0) {
          pfVar7 = pfVar13 + -5;
          pfVar9 = pfVar13 + -3;
          pfVar10 = pfVar13 + -2;
          uVar11 = uVar14;
          pfVar12 = pfVar13;
        }
        else {
          pfVar7 = pfVar3 + (ulong)puVar4[uVar14 + 1] * 3;
          pfVar9 = pfVar3 + (ulong)puVar4[uVar14 + 1] * 3 + 2;
          pfVar10 = pfVar3 + (ulong)puVar4[uVar14 + 2] * 3;
          uVar11 = (ulong)puVar4[uVar14];
          pfVar12 = pfVar3 + (ulong)puVar4[uVar14 + 2] * 3 + 2;
        }
        fVar1 = *pfVar9;
        fVar2 = *pfVar12;
        mat = model.transform;
        rVar15.z = pfVar3[uVar11 * 3 + 2];
        rVar15.x = (pfVar3 + uVar11 * 3)[0];
        rVar15.y = (pfVar3 + uVar11 * 3)[1];
        rVar15 = rf_vec3_transform(rVar15,mat);
        rVar16.z = fVar1;
        rVar16.x = pfVar7[0];
        rVar16.y = pfVar7[1];
        rVar16 = rf_vec3_transform(rVar16,mat);
        rVar17.z = fVar2;
        rVar17.x = pfVar10[0];
        rVar17.y = pfVar10[1];
        rVar17 = rf_vec3_transform(rVar17,mat);
        rf_collision_ray_triangle(&tri_hit_info,ray,rVar15,rVar16,rVar17);
        if ((tri_hit_info.hit == true) &&
           ((in_RDI->hit != true || (tri_hit_info.distance < in_RDI->distance)))) {
          *(undefined8 *)&(in_RDI->position).z = tri_hit_info._16_8_;
          (in_RDI->normal).y = tri_hit_info.normal.y;
          (in_RDI->normal).z = tri_hit_info.normal.z;
          in_RDI->hit = (_Bool)tri_hit_info.hit;
          *(int3 *)&in_RDI->field_0x1 = tri_hit_info._1_3_;
          in_RDI->distance = tri_hit_info.distance;
          (in_RDI->position).x = tri_hit_info.position.x;
          (in_RDI->position).y = tri_hit_info.position.y;
        }
        pfVar13 = pfVar13 + 9;
      }
    }
  }
  return in_RDI;
}

Assistant:

RF_API rf_ray_hit_info rf_collision_ray_model(rf_ray ray, rf_model model)
{
    rf_ray_hit_info result = {0};

    for (rf_int m = 0; m < model.mesh_count; m++)
    {
// Check if meshhas vertex data on CPU for testing
        if (model.meshes[m].vertices != NULL)
        {
// model->mesh.triangle_count may not be set, vertex_count is more reliable
            int triangle_count = model.meshes[m].vertex_count / 3;

// Test against all triangles in mesh
            for (rf_int i = 0; i < triangle_count; i++)
            {
                rf_vec3 a, b, c;
                rf_vec3 *vertdata = (rf_vec3 *) model.meshes[m].vertices;

                if (model.meshes[m].indices)
                {
                    a = vertdata[model.meshes[m].indices[i * 3 + 0]];
                    b = vertdata[model.meshes[m].indices[i * 3 + 1]];
                    c = vertdata[model.meshes[m].indices[i * 3 + 2]];
                } else
                {
                    a = vertdata[i * 3 + 0];
                    b = vertdata[i * 3 + 1];
                    c = vertdata[i * 3 + 2];
                }

                a = rf_vec3_transform(a, model.transform);
                b = rf_vec3_transform(b, model.transform);
                c = rf_vec3_transform(c, model.transform);

                rf_ray_hit_info tri_hit_info = rf_collision_ray_triangle(ray, a, b, c);

                if (tri_hit_info.hit)
                {
// Save the closest hit triangle
                    if ((!result.hit) || (result.distance > tri_hit_info.distance)) result = tri_hit_info;
                }
            }
        }
    }

    return result;
}